

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

bool __thiscall
glcts::GeometryShaderGetProgramiv3Test::buildShader
          (GeometryShaderGetProgramiv3Test *this,GLuint so_id,char *so_body)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  bool result;
  Functions *gl;
  char *pcStack_20;
  GLint compile_status;
  char *so_body_local;
  GeometryShaderGetProgramiv3Test *pGStack_10;
  GLuint so_id_local;
  GeometryShaderGetProgramiv3Test *this_local;
  long lVar4;
  
  gl._4_4_ = 0;
  pcStack_20 = so_body;
  so_body_local._4_4_ = so_id;
  pGStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x12b8))(so_body_local._4_4_,1,&stack0xffffffffffffffe0,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x2e0);
  (**(code **)(lVar4 + 0x248))(so_body_local._4_4_);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glCompileShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x2e3);
  (**(code **)(lVar4 + 0xa70))(so_body_local._4_4_,0x8b81,(long)&gl + 4);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGetShaderiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x2e6);
  return gl._4_4_ == 1;
}

Assistant:

bool GeometryShaderGetProgramiv3Test::buildShader(glw::GLuint so_id, const char* so_body)
{
	glw::GLint			  compile_status = GL_FALSE;
	const glw::Functions& gl			 = m_context.getRenderContext().getFunctions();
	bool				  result		 = false;

	gl.shaderSource(so_id, 1,			/* count */
					&so_body, DE_NULL); /* length */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	gl.compileShader(so_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	result = (compile_status == GL_TRUE);

	return result;
}